

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_dss_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                   size_t newlen)

{
  ulong uVar1;
  char *__s2;
  _Bool _Var2;
  int iVar3;
  dss_prec_t dVar4;
  size_t __n;
  arena_t *arena;
  dss_prec_t dss_prec;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  char *dss;
  char *local_38;
  
  local_38 = (char *)0x0;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp != (void *)0x0) {
    iVar3 = 0x16;
    if (newlen != 8) goto LAB_0012098f;
    local_38 = *newp;
  }
  __s2 = local_38;
  uVar1 = mib[1];
  iVar3 = 0xe;
  if (uVar1 >> 0x20 != 0) goto LAB_0012098f;
  if (local_38 == (char *)0x0) {
    dss_prec = dss_prec_limit;
  }
  else {
    iVar3 = strcmp(dss_prec_names[0],local_38);
    uVar6 = 0;
    if (iVar3 == 0) {
      bVar7 = true;
    }
    else {
      do {
        uVar5 = uVar6;
        bVar7 = uVar5 < 2;
        if (uVar5 == 2) {
          uVar6 = 3;
          goto LAB_001208a1;
        }
        iVar3 = strcmp(dss_prec_names[uVar5 + 1],__s2);
        uVar6 = uVar5 + 1;
      } while (iVar3 != 0);
      bVar7 = uVar5 < 2;
    }
LAB_001208a1:
    dss_prec = (dss_prec_t)uVar6;
    iVar3 = 0x16;
    if (!bVar7) goto LAB_0012098f;
  }
  if ((uVar1 == 0x1000) || (ctl_arenas->narenas == (uint)uVar1)) {
    if (dss_prec != dss_prec_limit) {
      _Var2 = extent_dss_prec_set(dss_prec);
      iVar3 = 0xe;
      if (_Var2) goto LAB_0012098f;
    }
    dVar4 = extent_dss_prec_get();
  }
  else {
    arena = (arena_t *)arenas[uVar1].repr;
    if (arena == (arena_t *)0x0) {
      arena = (arena_t *)0x0;
    }
    iVar3 = 0xe;
    dVar4 = dss_prec_limit;
    if (arena == (arena_t *)0x0) {
LAB_00120956:
      bVar7 = false;
    }
    else {
      if (dss_prec != dss_prec_limit) {
        _Var2 = arena_dss_prec_set(arena,dss_prec);
        if (_Var2) goto LAB_00120956;
      }
      dVar4 = arena_dss_prec_get(arena);
      iVar3 = 0x16;
      bVar7 = true;
    }
    if (!bVar7) goto LAB_0012098f;
  }
  local_38 = dss_prec_names[dVar4];
  iVar3 = 0;
  if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
    uVar1 = *oldlenp;
    if (uVar1 == 8) {
      *(char **)oldp = local_38;
      iVar3 = 0;
    }
    else {
      __n = 8;
      if (uVar1 < 8) {
        __n = uVar1;
      }
      memcpy(oldp,&local_38,__n);
      iVar3 = 0x16;
    }
  }
LAB_0012098f:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar3;
}

Assistant:

static int
arena_i_dss_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const char *dss = NULL;
	unsigned arena_ind;
	dss_prec_t dss_prec_old = dss_prec_limit;
	dss_prec_t dss_prec = dss_prec_limit;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(dss, const char *);
	MIB_UNSIGNED(arena_ind, 1);
	if (dss != NULL) {
		int i;
		bool match = false;

		for (i = 0; i < dss_prec_limit; i++) {
			if (strcmp(dss_prec_names[i], dss) == 0) {
				dss_prec = i;
				match = true;
				break;
			}
		}

		if (!match) {
			ret = EINVAL;
			goto label_return;
		}
	}

	/*
	 * Access via index narenas is deprecated, and scheduled for removal in
	 * 6.0.0.
	 */
	if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind ==
	    ctl_arenas->narenas) {
		if (dss_prec != dss_prec_limit &&
		    extent_dss_prec_set(dss_prec)) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = extent_dss_prec_get();
	} else {
		arena_t *arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL || (dss_prec != dss_prec_limit &&
		    arena_dss_prec_set(arena, dss_prec))) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = arena_dss_prec_get(arena);
	}

	dss = dss_prec_names[dss_prec_old];
	READ(dss, const char *);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}